

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglQueryConfigTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::GetConfigAttribBufferSizeCase::executeTest
          (GetConfigAttribBufferSizeCase *this,EGLConfig config)

{
  MessageBuilder *pMVar1;
  MessageBuilder local_ad0;
  MessageBuilder local_950;
  MessageBuilder local_7d0;
  MessageBuilder local_650;
  MessageBuilder local_4d0;
  MessageBuilder local_350;
  MessageBuilder local_1c0;
  EGLint local_3c;
  EGLint local_38;
  EGLint alphaSize;
  EGLint luminanceSize;
  EGLint blueSize;
  EGLint greenSize;
  EGLint redSize;
  EGLint bufferSize;
  EGLint colorBufferType;
  TestLog *log;
  EGLConfig config_local;
  GetConfigAttribBufferSizeCase *this_local;
  
  log = (TestLog *)config;
  config_local = this;
  _bufferSize = tcu::TestContext::getLog
                          ((this->super_GetConfigAttribCase).super_TestCase.super_TestCase.
                           super_TestNode.m_testCtx);
  redSize = GetConfigAttribCase::getValue(&this->super_GetConfigAttribCase,log,0x303f,true);
  greenSize = GetConfigAttribCase::getValue(&this->super_GetConfigAttribCase,log,0x3020,true);
  blueSize = GetConfigAttribCase::getValue(&this->super_GetConfigAttribCase,log,0x3024,true);
  luminanceSize = GetConfigAttribCase::getValue(&this->super_GetConfigAttribCase,log,0x3023,true);
  alphaSize = GetConfigAttribCase::getValue(&this->super_GetConfigAttribCase,log,0x3022,true);
  local_38 = GetConfigAttribCase::getValue(&this->super_GetConfigAttribCase,log,0x303d,true);
  local_3c = GetConfigAttribCase::getValue(&this->super_GetConfigAttribCase,log,0x3021,true);
  if (local_3c < 0) {
    tcu::TestLog::operator<<(&local_1c0,_bufferSize,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar1 = tcu::MessageBuilder::operator<<
                       (&local_1c0,(char (*) [43])"Fail, alpha size must be zero or positive.");
    tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1c0);
    tcu::TestContext::setTestResult
              ((this->super_GetConfigAttribCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx,QP_TEST_RESULT_FAIL,"Invalid alpha size");
  }
  if (redSize == 0x308e) {
    if (local_38 != 0) {
      tcu::TestLog::operator<<(&local_350,_bufferSize,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar1 = tcu::MessageBuilder::operator<<
                         (&local_350,
                          (char (*) [53])"Fail, luminance size must be zero for an RGB buffer.");
      tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_350);
      tcu::TestContext::setTestResult
                ((this->super_GetConfigAttribCase).super_TestCase.super_TestCase.super_TestNode.
                 m_testCtx,QP_TEST_RESULT_FAIL,"Invalid luminance size");
    }
    if (((blueSize < 1) || (luminanceSize < 1)) || (alphaSize < 1)) {
      tcu::TestLog::operator<<(&local_4d0,_bufferSize,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar1 = tcu::MessageBuilder::operator<<
                         (&local_4d0,
                          (char (*) [62])
                          "Fail, RGB component sizes must be positive for an RGB buffer.");
      tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_4d0);
      tcu::TestContext::setTestResult
                ((this->super_GetConfigAttribCase).super_TestCase.super_TestCase.super_TestNode.
                 m_testCtx,QP_TEST_RESULT_FAIL,"Invalid color component size");
    }
    if (greenSize != blueSize + luminanceSize + alphaSize + local_3c) {
      tcu::TestLog::operator<<(&local_650,_bufferSize,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar1 = tcu::MessageBuilder::operator<<
                         (&local_650,
                          (char (*) [82])
                          "Fail, buffer size must be equal to the sum of RGB component sizes and alpha size."
                         );
      tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_650);
      tcu::TestContext::setTestResult
                ((this->super_GetConfigAttribCase).super_TestCase.super_TestCase.super_TestNode.
                 m_testCtx,QP_TEST_RESULT_FAIL,"Invalid buffer size");
    }
  }
  else if (redSize == 0x308f) {
    if (local_38 < 1) {
      tcu::TestLog::operator<<(&local_7d0,_bufferSize,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar1 = tcu::MessageBuilder::operator<<
                         (&local_7d0,
                          (char (*) [62])
                          "Fail, luminance size must be positive for a luminance buffer.");
      tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_7d0);
      tcu::TestContext::setTestResult
                ((this->super_GetConfigAttribCase).super_TestCase.super_TestCase.super_TestNode.
                 m_testCtx,QP_TEST_RESULT_FAIL,"Invalid luminance size");
    }
    if (((blueSize != 0) || (luminanceSize != 0)) || (alphaSize != 0)) {
      tcu::TestLog::operator<<(&local_950,_bufferSize,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar1 = tcu::MessageBuilder::operator<<
                         (&local_950,
                          (char (*) [63])
                          "Fail, RGB component sizes must be zero for a luminance buffer.");
      tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_950);
      tcu::TestContext::setTestResult
                ((this->super_GetConfigAttribCase).super_TestCase.super_TestCase.super_TestNode.
                 m_testCtx,QP_TEST_RESULT_FAIL,"Invalid color component size");
    }
    if (greenSize != local_38 + local_3c) {
      tcu::TestLog::operator<<(&local_ad0,_bufferSize,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar1 = tcu::MessageBuilder::operator<<
                         (&local_ad0,
                          (char (*) [77])
                          "Fail, buffer size must be equal to the sum of luminance size and alpha size."
                         );
      tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_ad0);
      tcu::TestContext::setTestResult
                ((this->super_GetConfigAttribCase).super_TestCase.super_TestCase.super_TestNode.
                 m_testCtx,QP_TEST_RESULT_FAIL,"Invalid buffer size");
    }
  }
  return;
}

Assistant:

void executeTest (EGLConfig config)
	{
		TestLog&		log				= m_testCtx.getLog();

		const EGLint	colorBufferType	= getValue(config, EGL_COLOR_BUFFER_TYPE);

		const EGLint	bufferSize		= getValue(config, EGL_BUFFER_SIZE);
		const EGLint	redSize			= getValue(config, EGL_RED_SIZE);
		const EGLint	greenSize		= getValue(config, EGL_GREEN_SIZE);
		const EGLint	blueSize		= getValue(config, EGL_BLUE_SIZE);
		const EGLint	luminanceSize	= getValue(config, EGL_LUMINANCE_SIZE);
		const EGLint	alphaSize		= getValue(config, EGL_ALPHA_SIZE);

		if (alphaSize < 0)
		{
			log << TestLog::Message << "Fail, alpha size must be zero or positive." << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid alpha size");
		}

		if (colorBufferType == EGL_RGB_BUFFER)
		{
			if (luminanceSize != 0)
			{
				log << TestLog::Message << "Fail, luminance size must be zero for an RGB buffer." << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid luminance size");
			}

			if (redSize <= 0 || greenSize <= 0  || blueSize <= 0)
			{
				log << TestLog::Message << "Fail, RGB component sizes must be positive for an RGB buffer." << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid color component size");
			}

			if (bufferSize != (redSize + greenSize + blueSize + alphaSize))
			{
				log << TestLog::Message << "Fail, buffer size must be equal to the sum of RGB component sizes and alpha size." << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid buffer size");
			}
		}
		else if (colorBufferType == EGL_LUMINANCE_BUFFER)
		{
			if (luminanceSize <= 0)
			{
				log << TestLog::Message << "Fail, luminance size must be positive for a luminance buffer." << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid luminance size");
			}

			if (redSize != 0 || greenSize != 0  || blueSize != 0)
			{
				log << TestLog::Message << "Fail, RGB component sizes must be zero for a luminance buffer." << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid color component size");
			}

			if (bufferSize != (luminanceSize + alphaSize))
			{
				log << TestLog::Message << "Fail, buffer size must be equal to the sum of luminance size and alpha size." << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid buffer size");
			}
		}
	}